

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O0

string * __thiscall
Json::JsonParser::resolve_escape_hex_unicode_abi_cxx11_
          (string *__return_storage_ptr__,JsonParser *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 local_220 [8];
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  stringstream local_1b8 [4];
  int unicodeC;
  stringstream ss;
  undefined1 local_1a8 [394];
  allocator<char> local_1e;
  char local_1d;
  int local_1c;
  char c;
  JsonParser *pJStack_18;
  int i;
  JsonParser *this_local;
  
  pJStack_18 = this;
  this_local = (JsonParser *)__return_storage_ptr__;
  buffer_reset(this);
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar2 = (ostream *)std::ostream::operator<<(local_1a8,std::hex);
      pcVar3 = buffer_str(this);
      std::operator<<(poVar2,pcVar3);
      std::istream::operator>>((istream *)local_1b8,(int *)&convert.field_0x5c);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                         *)local_220);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::to_bytes(__return_storage_ptr__,
                 (wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                  *)local_220,convert._92_2_);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::~wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                          *)local_220);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      return __return_storage_ptr__;
    }
    local_1d = JsonReader::get(&this->__reader);
    bVar1 = is_hex(local_1d);
    if (!bVar1) break;
    buffer_append(this,local_1d);
    local_1c = local_1c + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::resolve_escape_hex_unicode() {
    buffer_reset();
    for (int i = 0; i < 4; i++) {
        char c = __reader.get();
        if (!is_hex(c)) return "";
        buffer_append(c);
    }
    std::stringstream ss;
    int unicodeC;
    ss << std::hex << buffer_str();
    ss >> unicodeC;
    std::wstring_convert<std::codecvt_utf8_utf16<char16_t>, char16_t> convert;
    return convert.to_bytes(unicodeC);
}